

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O0

void ncnn::convdw3x3s1_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  reference pvVar1;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  vector<float,_std::allocator<float>_> *in_R8;
  int sum;
  int remain;
  int i;
  char *r2;
  char *r1;
  char *r0;
  char *img0;
  char *kernel0;
  float scale_dequant;
  float bias0;
  float *outptr;
  Mat out;
  int p;
  float *bias;
  char *kernel;
  int outch;
  int outh;
  int outw;
  int w;
  int i_1;
  float *ptr;
  int size;
  Mat *m;
  Mat *m_1;
  float local_334;
  int local_300;
  int local_2fc;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined4 local_2c8;
  long local_2c0;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined8 local_2a0;
  char *local_298;
  char *local_290;
  float local_284;
  float local_280;
  float *local_270;
  float *local_268;
  int *local_260;
  ulong local_258;
  undefined4 local_250;
  long *local_248;
  int local_240;
  int local_23c;
  int local_238;
  undefined4 local_234;
  int local_230;
  ulong local_228;
  int local_21c;
  long local_218;
  long local_210;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  long *local_1d8;
  long *local_1d0;
  undefined8 *local_1c8;
  float **local_1b8;
  int local_198;
  undefined4 local_194;
  float **local_190;
  undefined8 *local_170;
  int local_164;
  float *local_160;
  int local_158;
  float local_154;
  float **local_150;
  undefined1 local_145;
  int local_144;
  float **local_138;
  float **local_118;
  undefined8 *local_108;
  float *local_e0;
  float **local_d0;
  undefined1 local_c5;
  int local_c4;
  undefined8 *local_b8;
  long local_90;
  undefined4 local_84;
  long local_80;
  char *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  long *local_58;
  undefined4 local_4c;
  ulong local_48;
  float *local_40;
  int local_34;
  int local_30;
  int local_2c;
  float **local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_1fc = *(int *)((long)in_RDI + 0x2c);
  local_200 = *(int *)((long)in_RSI + 0x2c);
  local_204 = (int)in_RSI[6];
  local_208 = (int)in_RSI[7];
  local_210 = *in_RDX;
  local_218 = *in_RCX;
  local_1d8 = in_RSI;
  local_1d0 = in_RDI;
  for (local_21c = 0; local_21c < local_208; local_21c = local_21c + 1) {
    local_138 = &local_268;
    local_2c = *(int *)((long)local_1d8 + 0x2c);
    local_30 = (int)local_1d8[6];
    local_34 = *(int *)((long)local_1d8 + 0x34);
    local_270 = (float *)(*local_1d8 + local_1d8[8] * (long)local_21c * local_1d8[2]);
    local_48 = local_1d8[2];
    local_4c = (undefined4)local_1d8[3];
    local_58 = (long *)local_1d8[4];
    local_28 = &local_268;
    local_260 = (int *)0x0;
    local_234 = 1;
    local_18 = (long)local_2c * (long)local_30 * local_48;
    local_228 = (local_18 + 0xfU & 0xfffffffffffffff0) / local_48;
    local_240 = (int)local_1d8[5] + -1;
    if ((int)local_1d8[5] == 4) {
      local_228 = (long)*(int *)((long)local_1d8 + 0x2c) * (long)(int)local_1d8[6];
    }
    local_1c = 0x10;
    local_144 = local_21c;
    local_145 = 1;
    local_118 = &local_268;
    if (local_218 == 0) {
      local_334 = 0.0;
    }
    else {
      local_334 = *(float *)(local_218 + (long)local_21c * 4);
    }
    local_280 = local_334;
    local_40 = local_270;
    local_268 = local_270;
    local_258 = local_48;
    local_250 = local_4c;
    local_248 = local_58;
    local_23c = local_2c;
    local_238 = local_30;
    local_230 = local_34;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in_R8,(long)local_21c);
    local_284 = *pvVar1;
    local_150 = &local_268;
    local_158 = (int)local_228 * local_230;
    local_160 = local_268;
    for (local_164 = 0; local_164 < local_158; local_164 = local_164 + 1) {
      *local_160 = local_280;
      local_160 = local_160 + 1;
    }
    local_290 = (char *)(local_210 + local_21c * 9);
    local_b8 = &local_2e0;
    local_64 = *(int *)((long)local_1d0 + 0x2c);
    local_68 = (int)local_1d0[6];
    local_6c = *(undefined4 *)((long)local_1d0 + 0x34);
    local_298 = (char *)(*local_1d0 + local_1d0[8] * (long)local_21c * local_1d0[2]);
    local_80 = local_1d0[2];
    local_84 = (undefined4)local_1d0[3];
    local_90 = local_1d0[4];
    local_60 = &local_2e0;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_108 = &local_2e0;
    local_1c8 = &local_2e0;
    local_c = 0x10;
    local_c4 = local_21c;
    local_c5 = 1;
    local_154 = local_280;
    local_2e0 = 0;
    local_2d0 = 0;
    local_2c8 = 0;
    local_2b8 = 0;
    local_2b4 = 0;
    local_2b0 = 0;
    local_2ac = 0;
    local_2a8 = 0;
    local_2a0 = 0;
    local_2d8 = 0;
    local_2f0 = local_298 + local_1fc;
    local_2f8 = local_298 + (local_1fc << 1);
    local_2e8 = local_298;
    for (local_2fc = 0; local_2fc < local_204; local_2fc = local_2fc + 1) {
      for (local_300 = local_200; 0 < local_300; local_300 = local_300 + -1) {
        *local_270 = (float)((int)local_2f8[2] * (int)local_290[8] +
                            (int)local_2f8[1] * (int)local_290[7] +
                            (int)*local_2f8 * (int)local_290[6] +
                            (int)local_2f0[2] * (int)local_290[5] +
                            (int)local_2f0[1] * (int)local_290[4] +
                            (int)*local_2f0 * (int)local_290[3] +
                            (int)local_2e8[2] * (int)local_290[2] +
                            (int)local_2e8[1] * (int)local_290[1] +
                            (int)*local_2e8 * (int)*local_290) * local_284 + *local_270;
        local_2e8 = local_2e8 + 1;
        local_2f0 = local_2f0 + 1;
        local_2f8 = local_2f8 + 1;
        local_270 = local_270 + 1;
      }
      local_2e8 = local_2e8 + 2;
      local_2f0 = local_2f0 + 2;
      local_2f8 = local_2f8 + 2;
    }
    local_1b8 = &local_268;
    local_190 = local_1b8;
    local_170 = local_1c8;
    local_d0 = local_150;
    local_78 = local_298;
    local_2c0 = local_90;
    if (local_260 != (int *)0x0) {
      local_194 = 0xffffffff;
      LOCK();
      local_198 = *local_260;
      *local_260 = *local_260 + -1;
      UNLOCK();
      if (local_198 == 1) {
        if (local_248 == (long *)0x0) {
          local_e0 = local_268;
          if (local_268 != (float *)0x0) {
            free(local_268);
          }
        }
        else {
          (**(code **)(*local_248 + 0x18))(local_248,local_268);
        }
      }
    }
  }
  return;
}

Assistant:

static void convdw3x3s1_int8_dequant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, std::vector<float> scales_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        float* outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_dequant = scales_dequant[p];

        out.fill(bias0);

        const signed char* kernel0 = (const signed char*)kernel + p * 9;

        const signed char* img0 = bottom_blob.channel(p);
        const signed char* r0 = img0;
        const signed char* r1 = img0 + w;
        const signed char* r2 = img0 + w * 2;

        int i = 0;
        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += (float)sum * scale_dequant;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}